

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

bool GenerateBlock(ChainstateManager *chainman,Mining *miner,CBlock *block,uint64_t *max_tries,
                  shared_ptr<const_CBlock> *block_out,bool process_new_block)

{
  uint32_t *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar2;
  uint256 hash;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  bool bVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  UniValue *__return_storage_ptr__;
  uint64_t uVar10;
  long lVar11;
  CBlock *pCVar12;
  element_type *peVar13;
  long in_FS_OFFSET;
  byte bVar14;
  uint256 local_78;
  string local_58;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var9 = (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  bVar7 = false;
  BlockMerkleRoot((uint256 *)&local_58,block,(bool *)0x0);
  *(size_type *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_58.field_2._M_allocated_capacity;
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_58.field_2._8_8_;
  *(pointer *)(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
       local_58._M_dataplus._M_p;
  *(size_type *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       local_58._M_string_length;
  if (*max_tries != 0) {
    if ((block->super_CBlockHeader).nNonce == 0xffffffff) {
LAB_00a1eeaa:
      bVar7 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      if (!bVar7) {
        bVar7 = true;
        if ((block->super_CBlockHeader).nNonce != 0xffffffff) {
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
          p_Var9->_M_use_count = 1;
          p_Var9->_M_weak_count = 1;
          p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0138ad70;
          pCVar12 = block;
          peVar13 = (element_type *)(p_Var9 + 1);
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            uVar3 = (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                    _M_elems[0];
            uVar4 = (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                    _M_elems[1];
            uVar5 = (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                    _M_elems[2];
            uVar6 = (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                    _M_elems[3];
            (peVar13->super_CBlockHeader).nVersion = (pCVar12->super_CBlockHeader).nVersion;
            (peVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
                 uVar3;
            (peVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
                 uVar4;
            (peVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
                 uVar5;
            (peVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
                 uVar6;
            pCVar12 = (CBlock *)((long)pCVar12 + (ulong)bVar14 * -0x10 + 8);
            peVar13 = (element_type *)((long)peVar13 + (ulong)bVar14 * -0x10 + 8);
          }
          psVar2 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          p_Var9[6]._vptr__Sp_counted_base =
               (_func_int **)
               (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)&p_Var9[6]._M_use_count = psVar2;
          p_Var9[7]._vptr__Sp_counted_base =
               (_func_int **)
               (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (block->vtx).
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (block->vtx).
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (block->vtx).
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(bool *)((long)&p_Var9[7]._M_use_count + 2) = block->m_checked_merkle_root;
          *(undefined2 *)&p_Var9[7]._M_use_count = *(undefined2 *)&block->fChecked;
          (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)(p_Var9 + 1);
          this = (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
          (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = p_Var9;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((process_new_block) &&
             (iVar8 = (*miner->_vptr_Mining[7])(miner,block_out,0), (char)iVar8 == '\0')) {
            __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"ProcessNewBlock, block not accepted","");
            JSONRPCError(__return_storage_ptr__,-0x7f5b,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00a1f045;
          }
        }
        goto LAB_00a1eebd;
      }
    }
    else {
      while( true ) {
        CBlockHeader::GetHash(&local_78,&block->super_CBlockHeader);
        hash.super_base_blob<256U>.m_data._M_elems[8] =
             local_78.super_base_blob<256U>.m_data._M_elems[8];
        hash.super_base_blob<256U>.m_data._M_elems[9] =
             local_78.super_base_blob<256U>.m_data._M_elems[9];
        hash.super_base_blob<256U>.m_data._M_elems[10] =
             local_78.super_base_blob<256U>.m_data._M_elems[10];
        hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xb];
        hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xc];
        hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xd];
        hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xe];
        hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xf];
        hash.super_base_blob<256U>.m_data._M_elems[0] =
             local_78.super_base_blob<256U>.m_data._M_elems[0];
        hash.super_base_blob<256U>.m_data._M_elems[1] =
             local_78.super_base_blob<256U>.m_data._M_elems[1];
        hash.super_base_blob<256U>.m_data._M_elems[2] =
             local_78.super_base_blob<256U>.m_data._M_elems[2];
        hash.super_base_blob<256U>.m_data._M_elems[3] =
             local_78.super_base_blob<256U>.m_data._M_elems[3];
        hash.super_base_blob<256U>.m_data._M_elems[4] =
             local_78.super_base_blob<256U>.m_data._M_elems[4];
        hash.super_base_blob<256U>.m_data._M_elems[5] =
             local_78.super_base_blob<256U>.m_data._M_elems[5];
        hash.super_base_blob<256U>.m_data._M_elems[6] =
             local_78.super_base_blob<256U>.m_data._M_elems[6];
        hash.super_base_blob<256U>.m_data._M_elems[7] =
             local_78.super_base_blob<256U>.m_data._M_elems[7];
        hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x10];
        hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x11];
        hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x12];
        hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x13];
        hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x14];
        hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x15];
        hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x16];
        hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x17];
        hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x18];
        hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x19];
        hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1a];
        hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1b];
        hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1c];
        hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1d];
        hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1e];
        hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1f];
        bVar7 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                                 &((chainman->m_options).chainparams)->consensus);
        if (bVar7) break;
        bVar7 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
        uVar10 = *max_tries;
        if (bVar7) goto LAB_00a1eea5;
        puVar1 = &(block->super_CBlockHeader).nNonce;
        *puVar1 = *puVar1 + 1;
        uVar10 = uVar10 - 1;
        *max_tries = uVar10;
        if ((uVar10 == 0) || ((block->super_CBlockHeader).nNonce == 0xffffffff)) goto LAB_00a1eea5;
      }
      uVar10 = *max_tries;
LAB_00a1eea5:
      if (uVar10 != 0) goto LAB_00a1eeaa;
    }
    bVar7 = false;
  }
LAB_00a1eebd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
LAB_00a1f045:
  __stack_chk_fail();
}

Assistant:

static bool GenerateBlock(ChainstateManager& chainman, Mining& miner, CBlock&& block, uint64_t& max_tries, std::shared_ptr<const CBlock>& block_out, bool process_new_block)
{
    block_out.reset();
    block.hashMerkleRoot = BlockMerkleRoot(block);

    while (max_tries > 0 && block.nNonce < std::numeric_limits<uint32_t>::max() && !CheckProofOfWork(block.GetHash(), block.nBits, chainman.GetConsensus()) && !chainman.m_interrupt) {
        ++block.nNonce;
        --max_tries;
    }
    if (max_tries == 0 || chainman.m_interrupt) {
        return false;
    }
    if (block.nNonce == std::numeric_limits<uint32_t>::max()) {
        return true;
    }

    block_out = std::make_shared<const CBlock>(std::move(block));

    if (!process_new_block) return true;

    if (!miner.processNewBlock(block_out, nullptr)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "ProcessNewBlock, block not accepted");
    }

    return true;
}